

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  (this->ClipRectFullscreen).x = 0.0;
  (this->ClipRectFullscreen).y = 0.0;
  (this->ClipRectFullscreen).z = 0.0;
  (this->ClipRectFullscreen).w = 0.0;
  lVar1 = 0;
  memset(this->ArcFastVtx,0,0x180);
  memset(this,0,0x200);
  do {
    fVar2 = (((float)(int)lVar1 + (float)(int)lVar1) * 3.1415927) / 48.0;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    this->ArcFastVtx[lVar1].x = fVar3;
    this->ArcFastVtx[lVar1].y = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x30);
  this->ArcFastRadiusCutoff = this->CircleSegmentMaxError / 0.0021410584;
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}